

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int bssl::SSL_SESSION_parse_u32(CBS *cbs,uint32_t *out,CBS_ASN1_TAG tag,uint32_t default_value)

{
  int iVar1;
  ulong local_30;
  uint64_t value;
  uint32_t default_value_local;
  CBS_ASN1_TAG tag_local;
  uint32_t *out_local;
  CBS *cbs_local;
  
  value._0_4_ = default_value;
  value._4_4_ = tag;
  _default_value_local = out;
  out_local = (uint32_t *)cbs;
  iVar1 = CBS_get_optional_asn1_uint64(cbs,&local_30,tag,(ulong)default_value);
  if ((iVar1 == 0) || (0xffffffff < local_30)) {
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1b8);
    cbs_local._4_4_ = 0;
  }
  else {
    *_default_value_local = (uint32_t)local_30;
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

static int SSL_SESSION_parse_u32(CBS *cbs, uint32_t *out, CBS_ASN1_TAG tag,
                                 uint32_t default_value) {
  uint64_t value;
  if (!CBS_get_optional_asn1_uint64(cbs, &value, tag,
                                    (uint64_t)default_value) ||
      value > 0xffffffff) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return 0;
  }
  *out = (uint32_t)value;
  return 1;
}